

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O1

bool __thiscall QOpenGLShader::compileSourceFile(QOpenGLShader *this,QString *fileName)

{
  char cVar1;
  bool bVar2;
  long in_FS_OFFSET;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_38,fileName);
  cVar1 = QFile::open((QFile *)&local_38,1);
  if (cVar1 == '\0') {
    compileSourceFile((QOpenGLShader *)fileName);
    bVar2 = false;
  }
  else {
    QIODevice::readAll();
    bVar2 = compileSourceCode(this,&DAT_aaaaaaaaaaaaaaaa);
    LOCK();
    _DAT_aaaaaaaaaaaaaaaa = _DAT_aaaaaaaaaaaaaaaa + -1;
    UNLOCK();
    if (_DAT_aaaaaaaaaaaaaaaa == 0) {
      QArrayData::deallocate((QArrayData *)&DAT_aaaaaaaaaaaaaaaa,1,0x10);
    }
  }
  QFile::~QFile((QFile *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QOpenGLShader::compileSourceFile(const QString& fileName)
{
    QFile file(fileName);
    if (!file.open(QFile::ReadOnly)) {
        qWarning() << "QOpenGLShader: Unable to open file" << fileName;
        return false;
    }

    QByteArray contents = file.readAll();
    return compileSourceCode(contents.constData());
}